

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::PixelFilter
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float __x;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *poVar4;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string extra;
  ParameterDictionary dict;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  vector<float,_std::allocator<float>_> local_168;
  vector<float,_std::allocator<float>_> local_150;
  vector<float,_std::allocator<float>_> local_138;
  char *local_120;
  long local_118;
  char local_110;
  undefined7 uStack_10f;
  float local_fc;
  ParameterDictionary local_f8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_f8,&local_90,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_90);
  local_118 = 0;
  local_110 = '\0';
  paVar1 = &local_1a8.field_2;
  local_120 = &local_110;
  if (this->upgrade == true) {
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"xwidth","");
    ParameterDictionary::GetFloatArray(&local_138,&local_f8,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                               local_1a8.field_2._M_local_buf[0]) + 1);
    }
    if ((long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 4) {
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"xwidth","");
      ParameterDictionary::RemoveFloat(&local_f8,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_188,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_local_buf[0] = '\0';
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string,float&>
                (&local_1a8,"%s\"float xradius\" [ %f ]\n",&local_188,
                 local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"ywidth","");
    ParameterDictionary::GetFloatArray(&local_150,&local_f8,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                               local_1a8.field_2._M_local_buf[0]) + 1);
    }
    if ((long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 4) {
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"ywidth","");
      ParameterDictionary::RemoveFloat(&local_f8,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_188,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_local_buf[0] = '\0';
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string,float&>
                (&local_1a8,"%s\"float yradius\" [ %f ]\n",&local_188,
                 local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      local_1a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"alpha","");
      ParameterDictionary::GetFloatArray(&local_168,&local_f8,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      if ((long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start == 4) {
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"alpha","");
        ParameterDictionary::RemoveFloat(&local_f8,&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.field_2._M_local_buf[0]) + 1);
        }
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_188,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
        __x = *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start +
              *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
        if (__x < 0.0) {
          local_fc = sqrtf(__x);
        }
        else {
          auVar2 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
          local_fc = auVar2._0_4_;
        }
        local_fc = 1.0 / local_fc;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_local_buf[0] = '\0';
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
        detail::stringPrintfRecursive<std::__cxx11::string,float>
                  (&local_1a8,"%s\"float sigma\" [ %f ]\n",&local_188,&local_fc);
        std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct
            ((ulong)&local_1a8,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sPixelFilter \"%s\"\n",&local_1a8,name)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_120,local_118);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_1a8,&local_f8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_f8.params);
  return;
}

Assistant:

void FormattingScene::PixelFilter(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> xr = dict.GetFloatArray("xwidth");
        if (xr.size() == 1) {
            dict.RemoveFloat("xwidth");
            extra += StringPrintf("%s\"float xradius\" [ %f ]\n", indent(1), xr[0]);
        }
        std::vector<Float> yr = dict.GetFloatArray("ywidth");
        if (yr.size() == 1) {
            dict.RemoveFloat("ywidth");
            extra += StringPrintf("%s\"float yradius\" [ %f ]\n", indent(1), yr[0]);
        }

        if (name == "gaussian") {
            std::vector<Float> alpha = dict.GetFloatArray("alpha");
            if (alpha.size() == 1) {
                dict.RemoveFloat("alpha");
                extra += StringPrintf("%s\"float sigma\" [ %f ]\n", indent(1),
                                      1 / std::sqrt(2 * alpha[0]));
            }
        }
    }

    Printf("%sPixelFilter \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}